

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_41e4::test_run_optimize(void **param_1)

{
  roaring64_bitmap_t *b;
  char *in_RDI;
  uint64_t i;
  roaring64_bitmap_t *r;
  roaring64_bitmap_t *in_stack_00000080;
  roaring64_bitmap_t *in_stack_000000a0;
  undefined8 in_stack_ffffffffffffffe8;
  int line;
  ulong uVar1;
  
  line = (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  b = roaring64_bitmap_create();
  roaring64_bitmap_add((roaring64_bitmap_t *)i,(uint64_t)in_RDI);
  roaring64_bitmap_run_optimize(in_stack_000000a0);
  _assert_true(i,in_RDI,(char *)b,line);
  assert_r64_valid((roaring64_bitmap_t *)b);
  for (uVar1 = 0; uVar1 < 30000; uVar1 = uVar1 + 1) {
    roaring64_bitmap_add((roaring64_bitmap_t *)i,(uint64_t)in_RDI);
  }
  roaring64_bitmap_run_optimize(in_stack_000000a0);
  _assert_true(i,in_RDI,(char *)b,(int)(uVar1 >> 0x20));
  assert_r64_valid((roaring64_bitmap_t *)b);
  roaring64_bitmap_free(in_stack_00000080);
  return;
}

Assistant:

DEFINE_TEST(test_run_optimize) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();

    roaring64_bitmap_add(r, 20000);
    assert_false(roaring64_bitmap_run_optimize(r));
    assert_r64_valid(r);

    for (uint64_t i = 0; i < 30000; ++i) {
        roaring64_bitmap_add(r, i);
    }
    assert_true(roaring64_bitmap_run_optimize(r));
    assert_r64_valid(r);

    roaring64_bitmap_free(r);
}